

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

void __thiscall gl4cts::GetTextureSubImage::Errors::clean(Errors *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  Errors *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_texture_1D != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_1D);
    this->m_texture_1D = 0;
  }
  if (this->m_texture_1D_array != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_1D_array);
    this->m_texture_1D_array = 0;
  }
  if (this->m_texture_2D != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_2D);
    this->m_texture_2D = 0;
  }
  if (this->m_texture_rectangle != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_rectangle);
    this->m_texture_rectangle = 0;
  }
  if (this->m_texture_2D_compressed != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_2D_compressed);
    this->m_texture_2D_compressed = 0;
  }
  if (this->m_texture_2D_multisampled != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_texture_2D_multisampled);
    this->m_texture_2D_multisampled = 0;
  }
  if (this->m_destination_buffer != (GLubyte *)0x0) {
    free(this->m_destination_buffer);
    this->m_destination_buffer = (GLubyte *)0x0;
  }
  return;
}

Assistant:

void gl4cts::GetTextureSubImage::Errors::clean()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*Textures cleanup. */
	if (m_texture_1D)
	{
		gl.deleteTextures(1, &m_texture_1D);
		m_texture_1D = 0;
	}

	if (m_texture_1D_array)
	{
		gl.deleteTextures(1, &m_texture_1D_array);
		m_texture_1D_array = 0;
	}

	if (m_texture_2D)
	{
		gl.deleteTextures(1, &m_texture_2D);
		m_texture_2D = 0;
	}
	if (m_texture_rectangle)
	{
		gl.deleteTextures(1, &m_texture_rectangle);
		m_texture_rectangle = 0;
	}

	if (m_texture_2D_compressed)
	{
		gl.deleteTextures(1, &m_texture_2D_compressed);
		m_texture_2D_compressed = 0;
	}

	if (m_texture_2D_multisampled)
	{
		gl.deleteTextures(1, &m_texture_2D_multisampled);
		m_texture_2D_multisampled = 0;
	}

	/* CPU buffers */
	if (m_destination_buffer)
	{
		free(m_destination_buffer);
		m_destination_buffer = DE_NULL;
	}
}